

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::visitCatchAll(Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this)

{
  size_t sVar1;
  size_t sVar2;
  ScopeCtx *pSVar3;
  Expression **ppEVar4;
  ExpressionList *this_00;
  SmallVector<unsigned_int,_1UL> *this_01;
  size_t i;
  uint *puVar5;
  ScopeCtx local_248;
  Try *local_198;
  SmallVector<unsigned_int,_1UL> *local_190;
  mapped_type *delimiterLocs;
  Err *local_168;
  Err *err;
  Result<wasm::Expression_*> _val;
  Result<wasm::Expression_*> expr;
  Err local_108;
  Try *local_d8;
  Try *tryy;
  undefined1 local_c8 [7];
  bool wasTry;
  ScopeCtx scope;
  IRBuilder *this_local;
  
  scope.startPos = (size_t)this;
  pSVar3 = getScope(this);
  ScopeCtx::ScopeCtx((ScopeCtx *)local_c8,pSVar3);
  tryy._7_1_ = 1;
  local_d8 = ScopeCtx::getTry((ScopeCtx *)local_c8);
  if (local_d8 == (Try *)0x0) {
    tryy._7_1_ = 0;
    local_d8 = ScopeCtx::getCatch((ScopeCtx *)local_c8);
  }
  if (local_d8 == (Try *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_108,"unexpected catch",
               (allocator<char> *)
               ((long)&expr.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                       super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> + 0x27));
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_108);
    wasm::Err::~Err(&local_108);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&expr.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                       super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> + 0x27));
    expr.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
    super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
    super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
    super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
    super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_index = '\x01';
    expr.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
    super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
    super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
    super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
    super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._33_3_ = 0;
  }
  else {
    finishScope((Result<wasm::Expression_*> *)
                ((long)&_val.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                        super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> + 0x20),this,
                (Block *)0x0);
    Result<wasm::Expression_*>::Result
              ((Result<wasm::Expression_*> *)&err,
               (Result<wasm::Expression_*> *)
               ((long)&_val.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                       super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> + 0x20));
    local_168 = Result<wasm::Expression_*>::getErr((Result<wasm::Expression_*> *)&err);
    expr.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
    super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
    super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
    super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
    super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_index = local_168 != (Err *)0x0;
    if ((bool)expr.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
              super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
              super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
              super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
              super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_index) {
      wasm::Err::Err((Err *)&delimiterLocs,local_168);
      Result<wasm::Ok>::Result(__return_storage_ptr__,(Err *)&delimiterLocs);
      wasm::Err::~Err((Err *)&delimiterLocs);
    }
    expr.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
    super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
    super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
    super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
    super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._33_3_ = 0;
    Result<wasm::Expression_*>::~Result((Result<wasm::Expression_*> *)&err);
    if (expr.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
        super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
        super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
        super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
        super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._32_4_ == 0) {
      if ((tryy._7_1_ & 1) == 0) {
        this_00 = &local_d8->catchBodies;
        ppEVar4 = Result<wasm::Expression_*>::operator*
                            ((Result<wasm::Expression_*> *)
                             ((long)&_val.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                                     super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> + 0x20));
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  (&this_00->
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                   *ppEVar4);
      }
      else {
        ppEVar4 = Result<wasm::Expression_*>::operator*
                            ((Result<wasm::Expression_*> *)
                             ((long)&_val.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                                     super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> + 0x20));
        local_d8->body = *ppEVar4;
      }
      if ((this->binaryPos != (size_t *)0x0) && (this->func != (Function *)0x0)) {
        local_198 = local_d8;
        this_01 = &std::
                   unordered_map<wasm::Expression_*,_wasm::ZeroInitSmallVector<unsigned_int,_1UL>,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::ZeroInitSmallVector<unsigned_int,_1UL>_>_>_>
                   ::operator[](&this->func->delimiterLocations,(key_type *)&local_198)->
                   super_SmallVector<unsigned_int,_1UL>;
        sVar1 = this->lastBinaryPos;
        sVar2 = this->codeSectionOffset;
        local_190 = this_01;
        i = SmallVector<unsigned_int,_1UL>::size(this_01);
        puVar5 = ZeroInitSmallVector<unsigned_int,_1UL>::operator[]
                           ((ZeroInitSmallVector<unsigned_int,_1UL> *)this_01,i);
        *puVar5 = (int)sVar1 - (int)sVar2;
      }
      ScopeCtx::makeCatchAll(&local_248,(ScopeCtx *)local_c8,local_d8);
      pushScope(__return_storage_ptr__,this,&local_248);
      ScopeCtx::~ScopeCtx(&local_248);
      expr.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
      super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
      super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
      super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
      super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_index = '\x01';
      expr.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
      super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
      super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
      super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
      super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._33_3_ = 0;
    }
    Result<wasm::Expression_*>::~Result
              ((Result<wasm::Expression_*> *)
               ((long)&_val.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                       super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> + 0x20));
  }
  ScopeCtx::~ScopeCtx((ScopeCtx *)local_c8);
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::visitCatchAll() {
  auto scope = getScope();
  bool wasTry = true;
  auto* tryy = scope.getTry();
  if (!tryy) {
    wasTry = false;
    tryy = scope.getCatch();
  }
  if (!tryy) {
    return Err{"unexpected catch"};
  }
  auto expr = finishScope();
  CHECK_ERR(expr);
  if (wasTry) {
    tryy->body = *expr;
  } else {
    tryy->catchBodies.push_back(*expr);
  }

  if (binaryPos && func) {
    auto& delimiterLocs = func->delimiterLocations[tryy];
    delimiterLocs[delimiterLocs.size()] = lastBinaryPos - codeSectionOffset;
  }

  return pushScope(ScopeCtx::makeCatchAll(std::move(scope), tryy));
}